

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

char * append_str(char *zText,int n,int p1,int p2)

{
  size_t sVar1;
  long lVar2;
  char local_58 [8];
  char zInt [40];
  int c;
  int p2_local;
  int p1_local;
  int n_local;
  char *zText_local;
  
  if (zText == (char *)0x0) {
    if ((append_str::used == 0) && (append_str::z != (char *)0x0)) {
      *append_str::z = '\0';
    }
    append_str::used = 0;
    zText_local = append_str::z;
  }
  else {
    p2_local = n;
    if (n < 1) {
      if ((n < 0) && (append_str::used = n + append_str::used, append_str::used < 0)) {
        __assert_fail("used>=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/lemon.c",
                      0xee0,"char *append_str(const char *, int, int, int)");
      }
      sVar1 = strlen(zText);
      p2_local = (int)sVar1;
    }
    if (append_str::alloced <= p2_local + 0x50 + append_str::used) {
      append_str::alloced = p2_local + append_str::used + 0x118;
      append_str::z = (char *)realloc(append_str::z,(long)append_str::alloced);
    }
    c = p1;
    _p1_local = zText;
    if (append_str::z == (char *)0x0) {
      zText_local = append_str::empty;
    }
    else {
      while (0 < p2_local) {
        if (((*_p1_local == '%') && (0 < p2_local + -1)) && (_p1_local[1] == 'd')) {
          lemon_sprintf(local_58,"%d",(ulong)(uint)c);
          lemon_strcpy(append_str::z + append_str::used,local_58);
          sVar1 = strlen(append_str::z + append_str::used);
          append_str::used = (int)sVar1 + append_str::used;
          c = p2;
          p2_local = p2_local + -2;
          _p1_local = _p1_local + 2;
        }
        else {
          lVar2 = (long)append_str::used;
          append_str::used = append_str::used + 1;
          append_str::z[lVar2] = *_p1_local;
          p2_local = p2_local + -1;
          _p1_local = _p1_local + 1;
        }
      }
      append_str::z[append_str::used] = '\0';
      zText_local = append_str::z;
    }
  }
  return zText_local;
}

Assistant:

PRIVATE char *append_str(const char *zText, int n, int p1, int p2){
  static char empty[1] = { 0 };
  static char *z = 0;
  static int alloced = 0;
  static int used = 0;
  int c;
  char zInt[40];
  if( zText==0 ){
    if( used==0 && z!=0 ) z[0] = 0;
    used = 0;
    return z;
  }
  if( n<=0 ){
    if( n<0 ){
      used += n;
      assert( used>=0 );
    }
    n = lemonStrlen(zText);
  }
  if( (int) (n+sizeof(zInt)*2+used) >= alloced ){
    alloced = n + sizeof(zInt)*2 + used + 200;
    z = (char *) realloc(z,  alloced);
  }
  if( z==0 ) return empty;
  while( n-- > 0 ){
    c = *(zText++);
    if( c=='%' && n>0 && zText[0]=='d' ){
      lemon_sprintf(zInt, "%d", p1);
      p1 = p2;
      lemon_strcpy(&z[used], zInt);
      used += lemonStrlen(&z[used]);
      zText++;
      n--;
    }else{
      z[used++] = (char)c;
    }
  }
  z[used] = 0;
  return z;
}